

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O1

float deqp::gles2::Performance::vectorFloatMedian<long>(vector<long,_std::allocator<long>_> *v)

{
  long lVar1;
  pointer plVar2;
  pointer plVar3;
  ulong uVar4;
  float fVar5;
  vector<long,_std::allocator<long>_> temp;
  vector<long,_std::allocator<long>_> local_28;
  
  std::vector<long,_std::allocator<long>_>::vector(&local_28,v);
  plVar3 = local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  plVar2 = local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar4 = (long)local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (plVar2,plVar3);
  }
  uVar4 = (ulong)((long)local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) >> 1;
  if (((long)local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start & 8U) == 0) {
    fVar5 = ((float)local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4] +
            (float)local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4 - 1]) * 0.5;
  }
  else {
    fVar5 = (float)local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4];
  }
  if (local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return fVar5;
}

Assistant:

static float vectorFloatMedian (const vector<T>& v)
{
	DE_ASSERT(!v.empty());
	vector<T> temp = v;
	std::sort(temp.begin(), temp.end());
	return temp.size() % 2 == 0
		   ? 0.5f * ((float)temp[temp.size()/2-1] + (float)temp[temp.size()/2])
		   : (float)temp[temp.size()/2];
}